

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.hpp
# Opt level: O0

void __thiscall
common_server_client_setup::common_server_client_setup
          (common_server_client_setup *this,bool initialize)

{
  common_server_client_setup *ctx;
  bool initialize_local;
  common_server_client_setup *this_local;
  
  zmq::context_t::context_t(&this->context);
  zmq::socket_t::socket_t(&this->server,&this->context,pair);
  ctx = this;
  zmq::socket_t::socket_t(&this->client,&this->context,pair);
  std::__cxx11::string::string((string *)&this->endpoint);
  if (initialize) {
    init(this,(EVP_PKEY_CTX *)ctx);
  }
  return;
}

Assistant:

common_server_client_setup(bool initialize = true)
    {
        if (initialize)
            init();
    }